

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_resp_handlers.cxx
# Opt level: O3

void __thiscall cornerstone::raft_server::handle_voting_resp(raft_server *this,resp_msg *resp)

{
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *this_00;
  element_type *peVar1;
  iterator iVar2;
  size_t sVar3;
  ulong uVar4;
  __node_base _Var5;
  __hashtable *__h;
  __node_gen_type __node_gen;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_b8 [2];
  undefined1 local_a8 [16];
  __node_base local_98 [2];
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_88;
  char *local_30;
  
  if ((resp->super_msg_base).term_ ==
      ((this->state_).super___shared_ptr<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->term_) {
    if (this->election_completed_ == true) {
      peVar1 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      local_98[0]._M_nxt = (_Hash_node_base *)&local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,
                 "Election completed, will ignore the voting result from this server","");
      (*peVar1->_vptr_logger[3])(peVar1,local_98);
      local_a8._0_8_ = local_88._M_buckets;
      _Var5._M_nxt = local_98[0]._M_nxt;
      if ((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
           *)local_98[0]._M_nxt == &local_88) {
        return;
      }
      goto LAB_0014f88c;
    }
    this_00 = &this->voted_servers_;
    local_98[0]._M_nxt._0_4_ = (resp->super_msg_base).src_;
    iVar2 = std::
            _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&this_00->_M_h,(key_type_conflict *)local_98);
    if (iVar2.super__Node_iterator_base<int,_false>._M_cur == (__node_type *)0x0) {
      std::__shared_mutex_pthread::lock_shared(&(this->peers_lock_).super___shared_timed_mutex_base)
      ;
      local_b8[0] = (_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)CONCAT44(local_b8[0]._4_4_,(resp->super_msg_base).src_);
      local_98[0]._M_nxt = (_Hash_node_base *)this_00;
      std::
      _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)this_00);
      if (resp->accepted_ == true) {
        this->votes_granted_ = this->votes_granted_ + 1;
      }
      uVar4 = (this->peers_)._M_h._M_element_count + 1;
      if (uVar4 <= (this->voted_servers_)._M_h._M_element_count) {
        this->election_completed_ = true;
      }
      if ((int)(uVar4 >> 1) < this->votes_granted_) {
        peVar1 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_30 = "Server is elected as leader for term %llu";
        snprintf((char *)local_98,100,"Server is elected as leader for term %llu",
                 ((this->state_).
                  super___shared_ptr<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 term_);
        local_b8[0] = (_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)local_a8;
        sVar3 = strlen((char *)local_98);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b8,local_98,(long)&local_98[0]._M_nxt + sVar3);
        (*peVar1->_vptr_logger[3])(peVar1,local_b8);
        if (local_b8[0] !=
            (_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             *)local_a8) {
          operator_delete(local_b8[0],local_a8._0_8_ + 1);
        }
        this->election_completed_ = true;
        become_leader(this);
      }
      pthread_rwlock_unlock((pthread_rwlock_t *)&this->peers_lock_);
      return;
    }
    peVar1 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_30 = "Duplicate vote from %d for term %lld";
    snprintf((char *)local_98,100,"Duplicate vote from %d for term %lld",
             (ulong)(uint)(resp->super_msg_base).src_,
             ((this->state_).super___shared_ptr<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->term_);
    local_b8[0] = (_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_a8;
    sVar3 = strlen((char *)local_98);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,local_98,(long)&local_98[0]._M_nxt + sVar3);
    (*peVar1->_vptr_logger[3])(peVar1,local_b8);
  }
  else {
    peVar1 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_30 = "Received an outdated vote response at term %llu v.s. current term %llu";
    snprintf((char *)local_98,100,
             "Received an outdated vote response at term %llu v.s. current term %llu");
    local_b8[0] = (_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_a8;
    sVar3 = strlen((char *)local_98);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,local_98,(long)&local_98[0]._M_nxt + sVar3);
    (*peVar1->_vptr_logger[3])(peVar1,local_b8);
  }
  _Var5._M_nxt = (_Hash_node_base *)local_b8[0];
  if (local_b8[0] ==
      (_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
       *)local_a8) {
    return;
  }
LAB_0014f88c:
  operator_delete(_Var5._M_nxt,local_a8._0_8_ + 1);
  return;
}

Assistant:

void raft_server::handle_voting_resp(resp_msg& resp)
{
    if (resp.get_term() != state_->get_term())
    {
        l_->info(sstrfmt("Received an outdated vote response at term %llu v.s. current term %llu")
                     .fmt(resp.get_term(), state_->get_term()));
        return;
    }

    if (election_completed_)
    {
        l_->info("Election completed, will ignore the voting result from this server");
        return;
    }

    if (voted_servers_.find(resp.get_src()) != voted_servers_.end())
    {
        l_->info(sstrfmt("Duplicate vote from %d for term %lld").fmt(resp.get_src(), state_->get_term()));
        return;
    }

    {
        read_lock(peers_lock_);
        voted_servers_.insert(resp.get_src());
        if (resp.get_accepted())
        {
            votes_granted_ += 1;
        }

        if (voted_servers_.size() >= (peers_.size() + 1))
        {
            election_completed_ = true;
        }

        if (votes_granted_ > (int32)((peers_.size() + 1) / 2))
        {
            l_->info(sstrfmt("Server is elected as leader for term %llu").fmt(state_->get_term()));
            election_completed_ = true;
            become_leader();
        }
    }
}